

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O2

void __thiscall
gl3cts::TransformFeedbackOverflowQueryFunctionalBase::buildTransformFeedbackProgram
          (TransformFeedbackOverflowQueryFunctionalBase *this)

{
  code *pcVar1;
  int iVar2;
  GLuint GVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TestError *pTVar8;
  allocator<char> local_81;
  GLint infoLogLength_1;
  GLint status;
  vector<char,_std::allocator<char>_> infoLogBuf;
  char *gsSource;
  string infoLog;
  char *vsSource;
  long lVar7;
  
  iVar2 = (*((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(lVar7 + 0x3c8))();
  this->m_program = GVar3;
  iVar2 = (*(this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.super_TestCase.
            super_TestNode._vptr_TestNode[5])(this);
  vsSource = (char *)CONCAT44(extraout_var_00,iVar2);
  uVar4 = (**(code **)(lVar7 + 0x3f0))(0x8b31);
  (**(code **)(lVar7 + 0x12b8))(uVar4,1,&vsSource,0);
  (**(code **)(lVar7 + 0x248))(uVar4);
  (**(code **)(lVar7 + 0xa70))(uVar4,0x8b81,&status);
  if (status == 0) {
    gsSource = (char *)((ulong)gsSource._4_4_ << 0x20);
    (**(code **)(lVar7 + 0xa70))(uVar4,0x8b84,&gsSource);
    std::vector<char,_std::allocator<char>_>::vector
              (&infoLogBuf,(long)((int)gsSource + 1),(allocator_type *)&infoLog);
    (**(code **)(lVar7 + 0xa58))
              (uVar4,(int)infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                     (int)infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&infoLog,
               infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,(allocator<char> *)&infoLogLength_1);
    tcu::TestLog::writeShader
              (((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.super_TestCase.
                super_TestNode.m_testCtx)->m_log,QP_SHADER_TYPE_VERTEX,vsSource,false,
               infoLog._M_dataplus._M_p);
    (**(code **)(lVar7 + 0x470))(uVar4);
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Failed to compile transform feedback vertex shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
               ,0x4d0);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar7 + 0x10))(this->m_program,uVar4);
  (**(code **)(lVar7 + 0x470))(uVar4);
  iVar2 = (*(this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.super_TestCase.
            super_TestNode._vptr_TestNode[6])(this);
  gsSource = (char *)CONCAT44(extraout_var_01,iVar2);
  if (gsSource != (char *)0x0) {
    uVar4 = (**(code **)(lVar7 + 0x3f0))(0x8dd9);
    (**(code **)(lVar7 + 0x12b8))(uVar4,1,&gsSource,0);
    (**(code **)(lVar7 + 0x248))(uVar4);
    (**(code **)(lVar7 + 0xa70))(uVar4,0x8b81,&status);
    if (status == 0) {
      infoLogLength_1 = 0;
      (**(code **)(lVar7 + 0xa70))(uVar4,0x8b84,&infoLogLength_1);
      std::vector<char,_std::allocator<char>_>::vector
                (&infoLogBuf,(long)(infoLogLength_1 + 1),(allocator_type *)&infoLog);
      (**(code **)(lVar7 + 0xa58))
                (uVar4,(int)infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                       (int)infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&infoLog,
                 infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,&local_81);
      tcu::TestLog::writeShader
                (((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.super_TestCase
                  .super_TestNode.m_testCtx)->m_log,QP_SHADER_TYPE_GEOMETRY,gsSource,false,
                 infoLog._M_dataplus._M_p);
      (**(code **)(lVar7 + 0x470))(uVar4);
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,"Failed to compile transform feedback geometry shader",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
                 ,0x4ea);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar7 + 0x10))(this->m_program,uVar4);
    (**(code **)(lVar7 + 0x470))(uVar4);
  }
  pcVar1 = *(code **)(lVar7 + 0x14c8);
  GVar3 = this->m_program;
  iVar2 = (*(this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.super_TestCase.
            super_TestNode._vptr_TestNode[7])(this);
  iVar5 = (*(this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.super_TestCase.
            super_TestNode._vptr_TestNode[8])(this);
  iVar6 = (*(this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.super_TestCase.
            super_TestNode._vptr_TestNode[9])(this);
  (*pcVar1)(GVar3,iVar2,iVar5,iVar6);
  (**(code **)(lVar7 + 0xce8))(this->m_program);
  (**(code **)(lVar7 + 0x9d8))(this->m_program,0x8b82,&status);
  if (status != 0) {
    (**(code **)(lVar7 + 0x1680))(this->m_program);
    return;
  }
  infoLogLength_1 = 0;
  (**(code **)(lVar7 + 0x9d8))(this->m_program,0x8b84,&infoLogLength_1);
  std::vector<char,_std::allocator<char>_>::vector
            (&infoLogBuf,(long)(infoLogLength_1 + 1),(allocator_type *)&infoLog);
  (**(code **)(lVar7 + 0x988))
            (this->m_program,
             (int)infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
             (int)infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&infoLog,
             infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,&local_81);
  tcu::TestLog::writeShader
            (((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.super_TestCase.
              super_TestNode.m_testCtx)->m_log,QP_SHADER_TYPE_VERTEX,vsSource,true,
             infoLog._M_dataplus._M_p);
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,"Failed to link transform feedback program",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
             ,0x4fe);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void buildTransformFeedbackProgram()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		GLint status;

		m_program = gl.createProgram();

		const char* vsSource = transformFeedbackVertexShader();

		GLuint vShader = gl.createShader(GL_VERTEX_SHADER);
		gl.shaderSource(vShader, 1, (const char**)&vsSource, NULL);
		gl.compileShader(vShader);
		gl.getShaderiv(vShader, GL_COMPILE_STATUS, &status);
		if (status == GL_FALSE)
		{
			GLint infoLogLength = 0;
			gl.getShaderiv(vShader, GL_INFO_LOG_LENGTH, &infoLogLength);

			std::vector<char> infoLogBuf(infoLogLength + 1);
			gl.getShaderInfoLog(vShader, (GLsizei)infoLogBuf.size(), NULL, &infoLogBuf[0]);

			std::string infoLog = &infoLogBuf[0];
			m_testCtx.getLog().writeShader(QP_SHADER_TYPE_VERTEX, vsSource, false, infoLog.c_str());

			gl.deleteShader(vShader);

			TCU_FAIL("Failed to compile transform feedback vertex shader");
		}
		gl.attachShader(m_program, vShader);
		gl.deleteShader(vShader);

		const char* gsSource = transformFeedbackGeometryShader();

		if (gsSource)
		{
			GLuint gShader = gl.createShader(GL_GEOMETRY_SHADER);
			gl.shaderSource(gShader, 1, (const char**)&gsSource, NULL);
			gl.compileShader(gShader);
			gl.getShaderiv(gShader, GL_COMPILE_STATUS, &status);
			if (status == GL_FALSE)
			{
				GLint infoLogLength = 0;
				gl.getShaderiv(gShader, GL_INFO_LOG_LENGTH, &infoLogLength);

				std::vector<char> infoLogBuf(infoLogLength + 1);
				gl.getShaderInfoLog(gShader, (GLsizei)infoLogBuf.size(), NULL, &infoLogBuf[0]);

				std::string infoLog = &infoLogBuf[0];
				m_testCtx.getLog().writeShader(QP_SHADER_TYPE_GEOMETRY, gsSource, false, infoLog.c_str());

				gl.deleteShader(gShader);

				TCU_FAIL("Failed to compile transform feedback geometry shader");
			}
			gl.attachShader(m_program, gShader);
			gl.deleteShader(gShader);
		}

		gl.transformFeedbackVaryings(m_program, varyingsCount(), varyings(), bufferMode());
		gl.linkProgram(m_program);
		gl.getProgramiv(m_program, GL_LINK_STATUS, &status);
		if (status == GL_FALSE)
		{
			GLint infoLogLength = 0;
			gl.getProgramiv(m_program, GL_INFO_LOG_LENGTH, &infoLogLength);

			std::vector<char> infoLogBuf(infoLogLength + 1);
			gl.getProgramInfoLog(m_program, (GLsizei)infoLogBuf.size(), NULL, &infoLogBuf[0]);

			std::string infoLog = &infoLogBuf[0];
			m_testCtx.getLog().writeShader(QP_SHADER_TYPE_VERTEX, vsSource, true, infoLog.c_str());

			TCU_FAIL("Failed to link transform feedback program");
		}

		gl.useProgram(m_program);
	}